

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_evsa.cpp
# Opt level: O0

void __thiscall
phoenix_evsa_t::evsa_body_t::evsa_body_t
          (evsa_body_t *this,kstream *p__io,phoenix_evsa_t *p__parent,phoenix_evsa_t *p__root)

{
  phoenix_evsa_t *p__root_local;
  phoenix_evsa_t *p__parent_local;
  kstream *p__io_local;
  evsa_body_t *this_local;
  
  kaitai::kstruct::kstruct(&this->super_kstruct,p__io);
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__evsa_body_t_0037b030;
  std::
  unique_ptr<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>,std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>>>,std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>,std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>,std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>>>>,void>
            ((unique_ptr<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>,std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>>>,std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>,std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,std::default_delete<phoenix_evsa_t::evsa_entry_t>>>>>>
              *)&this->m_entries);
  std::
  unique_ptr<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::unique_ptr<std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((unique_ptr<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::default_delete<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&this->m_free_space);
  this->m__parent = p__parent;
  this->m__root = p__root;
  std::
  unique_ptr<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>,_std::allocator<std::unique_ptr<phoenix_evsa_t::evsa_entry_t,_std::default_delete<phoenix_evsa_t::evsa_entry_t>_>_>_>_>_>
  ::operator=(&this->m_entries,(nullptr_t)0x0);
  std::
  unique_ptr<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::default_delete<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&this->m_free_space,(nullptr_t)0x0);
  _read(this);
  return;
}

Assistant:

phoenix_evsa_t::evsa_body_t::evsa_body_t(kaitai::kstream* p__io, phoenix_evsa_t* p__parent, phoenix_evsa_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = p__root;
    m_entries = nullptr;
    m_free_space = nullptr;
    _read();
}